

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatictext.cpp
# Opt level: O2

int __thiscall QStaticTextPrivate::init(QStaticTextPrivate *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  QStaticTextUserData *pQVar2;
  Data *pDVar3;
  uint *__src;
  undefined1 auVar4 [16];
  ulong uVar5;
  DrawTextItemRecorder *this_00;
  ulong *puVar6;
  glyph_t *__dest;
  QFixedPoint *pQVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  QStaticTextItem *pQVar11;
  ulong uVar12;
  int i;
  long in_FS_OFFSET;
  QPainter painter;
  QArrayDataPointer<QStaticTextItem> local_88;
  undefined1 local_68 [16];
  DrawTextItemRecorder *local_58;
  undefined1 local_50 [16];
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar11 = this->items;
  if (pQVar11 != (QStaticTextItem *)0x0) {
    pQVar2 = pQVar11[-1].m_userData.d.ptr;
    if (pQVar2 != (QStaticTextUserData *)0x0) {
      lVar9 = (long)pQVar2 * 0x50;
      do {
        QStaticTextItem::~QStaticTextItem((QStaticTextItem *)((long)&pQVar11[-1].field_0 + lVar9));
        lVar9 = lVar9 + -0x50;
      } while (lVar9 != 0);
    }
    operator_delete__(&pQVar11[-1].m_userData,(long)pQVar2 * 0x50 | 8);
  }
  if (this->glyphPool != (glyph_t *)0x0) {
    operator_delete__(this->glyphPool);
  }
  if (this->positionPool != (QFixedPoint *)0x0) {
    operator_delete__(this->positionPool);
  }
  (this->position).xp = 0.0;
  (this->position).yp = 0.0;
  local_58 = (DrawTextItemRecorder *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = this->field_0xe0;
  QPaintDevice::QPaintDevice((QPaintDevice *)local_68);
  local_68._0_8_ = &PTR__DrawTextItemDevice_007861f8;
  this_00 = (DrawTextItemRecorder *)operator_new(0x80);
  QPaintEngine::QPaintEngine((QPaintEngine *)this_00,(PaintEngineFeatures)0x0);
  (this_00->super_QPaintEngine)._vptr_QPaintEngine =
       (_func_int **)&PTR__DrawTextItemRecorder_00786260;
  (this_00->m_items).d.d = (Data *)0x0;
  (this_00->m_items).d.ptr = (QStaticTextItem *)0x0;
  (this_00->m_items).d.size = 0;
  (this_00->m_positions).d.d = (Data *)0x0;
  (this_00->m_positions).d.ptr = (QFixedPoint *)0x0;
  (this_00->m_positions).d.size = 0;
  (this_00->m_glyphs).d.d = (Data *)0x0;
  (this_00->m_glyphs).d.ptr = (uint *)0x0;
  *(undefined8 *)((long)&(this_00->m_glyphs).d.ptr + 1) = 0;
  *(undefined8 *)((long)&(this_00->m_glyphs).d.size + 1) = 0;
  this_00->m_useBackendOptimizations = (bool)(bVar1 >> 1 & 1);
  this_00->m_untransformedCoordinates = (bool)(bVar1 >> 4 & 1);
  (this_00->m_currentColor).cspec = Rgb;
  *(undefined8 *)&(this_00->m_currentColor).ct = 0;
  (this_00->m_currentColor).ct.argb.pad = 0;
  painter.d_ptr._M_t.super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
  super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
       (unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = this_00;
  QPainter::QPainter(&painter,(QPaintDevice *)local_68);
  QPainter::setFont(&painter,&this->font);
  QPainter::setTransform(&painter,&this->matrix,false);
  local_50._4_4_ = 0;
  local_50._8_4_ = 0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (QStaticTextItem *)0x0;
  local_50._12_2_ = 0;
  local_50._0_4_ = Rgb;
  paintText(this,(QPointF *)&local_88,&painter,(QColor *)local_50);
  QPainter::~QPainter(&painter);
  local_88.d = (local_58->m_items).d.d;
  local_88.ptr = (local_58->m_items).d.ptr;
  local_88.size = (local_58->m_items).d.size;
  if (local_88.d != (Data *)0x0) {
    LOCK();
    ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar3 = (local_58->m_positions).d.d;
  local_50._0_4_ = SUB84(pDVar3,0);
  local_50._4_4_ = (undefined4)((ulong)pDVar3 >> 0x20);
  pQVar7 = (local_58->m_positions).d.ptr;
  local_50._8_4_ = SUB84(pQVar7,0);
  local_50._12_2_ = (undefined2)((ulong)pQVar7 >> 0x20);
  local_50._14_2_ = (undefined2)((ulong)pQVar7 >> 0x30);
  local_40 = (local_58->m_positions).d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  painter.d_ptr._M_t.super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>.
  _M_t.super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
  super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
       (unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>)(local_58->m_glyphs).d.d;
  __src = (local_58->m_glyphs).d.ptr;
  lVar9 = (local_58->m_glyphs).d.size;
  if ((__uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>)
      painter.d_ptr._M_t.
      super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
      super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
      super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>)0x0) {
    LOCK();
    *(int *)painter.d_ptr._M_t.
            super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
            super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
            super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl =
         *(int *)painter.d_ptr._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl + 1;
    UNLOCK();
  }
  uVar10 = (ulong)(int)local_88.size;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar10;
  this->itemCount = (int)local_88.size;
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x50),8) == 0) {
    uVar12 = SUB168(auVar4 * ZEXT816(0x50),0) | 8;
  }
  uVar5 = local_88.size & 0xffffffff;
  puVar6 = (ulong *)operator_new__(uVar12);
  *puVar6 = uVar10;
  if (uVar5 != 0) {
    lVar8 = uVar10 * 0x50;
    pQVar11 = (QStaticTextItem *)(puVar6 + 1);
    do {
      QStaticTextItem::QStaticTextItem(pQVar11);
      pQVar11 = pQVar11 + 1;
      lVar8 = lVar8 + -0x50;
    } while (lVar8 != 0);
  }
  this->items = (QStaticTextItem *)(puVar6 + 1);
  uVar12 = lVar9 << 2;
  __dest = (glyph_t *)operator_new__(uVar12);
  this->glyphPool = __dest;
  memcpy(__dest,__src,uVar12);
  lVar9 = local_40;
  uVar12 = local_40 * 8;
  pQVar7 = (QFixedPoint *)operator_new__(uVar12);
  if (lVar9 != 0) {
    memset(pQVar7,0,uVar12);
  }
  this->positionPool = pQVar7;
  memcpy(pQVar7,(void *)CONCAT26(local_50._14_2_,CONCAT24(local_50._12_2_,local_50._8_4_)),uVar12);
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < this->itemCount; lVar8 = lVar8 + 1) {
    QStaticTextItem::operator=
              ((QStaticTextItem *)((long)&this->items->field_0 + lVar9),
               (QStaticTextItem *)((long)&(local_88.ptr)->field_0 + lVar9));
    *(glyph_t **)((long)&this->items->field_1 + lVar9) =
         this->glyphPool + *(int *)((long)&this->items->field_1 + lVar9);
    *(QFixedPoint **)((long)&this->items->field_0 + lVar9) =
         this->positionPool + *(int *)((long)&this->items->field_0 + lVar9);
    lVar9 = lVar9 + 0x50;
  }
  this->field_0xe0 = this->field_0xe0 & 0xfe;
  QArrayDataPointer<unsigned_int>::~QArrayDataPointer((QArrayDataPointer<unsigned_int> *)&painter);
  QArrayDataPointer<QFixedPoint>::~QArrayDataPointer((QArrayDataPointer<QFixedPoint> *)local_50);
  QArrayDataPointer<QStaticTextItem>::~QArrayDataPointer(&local_88);
  anon_unknown.dwarf_1408f84::DrawTextItemDevice::~DrawTextItemDevice
            ((DrawTextItemDevice *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QStaticTextPrivate::init()
{
    delete[] items;
    delete[] glyphPool;
    delete[] positionPool;

    position = QPointF(0, 0);

    DrawTextItemDevice device(untransformedCoordinates, useBackendOptimizations);
    {
        QPainter painter(&device);
        painter.setFont(font);
        painter.setTransform(matrix);

        paintText(QPointF(0, 0), &painter, QColor(0, 0, 0, 0));
    }

    QList<QStaticTextItem> deviceItems = device.items();
    QList<QFixedPoint> positions = device.positions();
    QList<glyph_t> glyphs = device.glyphs();

    itemCount = deviceItems.size();
    items = new QStaticTextItem[itemCount];

    glyphPool = new glyph_t[glyphs.size()];
    memcpy(glyphPool, glyphs.constData(), glyphs.size() * sizeof(glyph_t));

    positionPool = new QFixedPoint[positions.size()];
    memcpy(positionPool, positions.constData(), positions.size() * sizeof(QFixedPoint));

    for (int i=0; i<itemCount; ++i) {
        items[i] = deviceItems.at(i);

        items[i].glyphs = glyphPool + items[i].glyphOffset;
        items[i].glyphPositions = positionPool + items[i].positionOffset;
    }

    needsRelayout = false;
}